

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-interface.c
# Opt level: O1

void sv_send_cb(uv_udp_send_t *req,int status)

{
  int iVar1;
  bool bVar2;
  undefined8 *extraout_RDX;
  void **ppvVar3;
  uv_udp_t *puVar4;
  int in_R8D;
  int64_t eval_b;
  int64_t eval_a;
  void *pvStack_28;
  undefined1 auStack_20 [16];
  void *local_10;
  uv_handle_t *handle;
  
  if (req == (uv_udp_send_t *)0x0) {
    auStack_20._0_8_ = (void *)0x1dd446;
    sv_send_cb_cold_3();
LAB_001dd446:
    auStack_20._0_8_ = (void *)0x1dd453;
    sv_send_cb_cold_1();
  }
  else {
    local_10 = (void *)(long)status;
    auStack_20._8_8_ = (uv_loop_t *)0x0;
    if (local_10 != (void *)0x0) goto LAB_001dd446;
    puVar4 = req->handle;
    local_10 = (void *)(ulong)(puVar4 == &client || puVar4 == &server);
    auStack_20._8_8_ = (uv_loop_t *)0x0;
    if (local_10 != (void *)0x0) {
      auStack_20._0_8_ = (void *)0x1dd42d;
      uv_close((uv_handle_t *)puVar4,close_cb);
      auStack_20._0_8_ = (void *)0x1dd435;
      free(req);
      sv_send_cb_called = sv_send_cb_called + 1;
      return;
    }
  }
  puVar4 = (uv_udp_t *)&stack0xfffffffffffffff0;
  auStack_20._0_8_ = close_cb;
  sv_send_cb_cold_2();
  bVar2 = puVar4 == &client || puVar4 == &server;
  handle = (uv_handle_t *)CONCAT71(0x10185,bVar2);
  auStack_20._0_8_ = ZEXT18(bVar2);
  pvStack_28 = (void *)0x0;
  if ((void *)auStack_20._0_8_ == (void *)0x0) {
    close_cb_cold_2();
  }
  else {
    auStack_20._0_8_ = (void *)0x1;
    iVar1 = uv_is_closing((uv_handle_t *)puVar4);
    pvStack_28 = (void *)(long)iVar1;
    if ((void *)auStack_20._0_8_ == pvStack_28) {
      close_cb_called = close_cb_called + 1;
      return;
    }
  }
  puVar4 = (uv_udp_t *)auStack_20;
  ppvVar3 = &pvStack_28;
  close_cb_cold_1();
  if (puVar4 == &client || puVar4 == &server) {
    if (in_R8D != 0) goto LAB_001dd5b4;
    if ((long)ppvVar3 < 0) goto LAB_001dd5c1;
    if (ppvVar3 == (void **)0x0) {
      if (handle == (uv_handle_t *)0x0) {
        return;
      }
      goto LAB_001dd5dd;
    }
    if (handle == (uv_handle_t *)0x0) goto LAB_001dd5c6;
    handle = (uv_handle_t *)0x4;
    if (ppvVar3 != (void **)0x4) goto LAB_001dd5cb;
    iVar1 = bcmp("PONG",(void *)*extraout_RDX,4);
    if (iVar1 == 0) {
      cl_recv_cb_called = cl_recv_cb_called + 1;
      uv_close((uv_handle_t *)puVar4,close_cb);
      return;
    }
  }
  else {
    cl_recv_cb_cold_7();
LAB_001dd5b4:
    cl_recv_cb_cold_1();
LAB_001dd5c1:
    cl_recv_cb_cold_6();
LAB_001dd5c6:
    cl_recv_cb_cold_4();
LAB_001dd5cb:
    cl_recv_cb_cold_2();
  }
  cl_recv_cb_cold_3();
LAB_001dd5dd:
  cl_recv_cb_cold_5();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void sv_send_cb(uv_udp_send_t* req, int status) {
  ASSERT_NOT_NULL(req);
  ASSERT(status == 0 || status == UV_ENETUNREACH || status == UV_EPERM);
  CHECK_HANDLE(req->handle);

  sv_send_cb_called++;

  uv_close((uv_handle_t*) req->handle, close_cb);
}